

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_CountdownArg
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int *piVar1;
  uint uVar2;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FState *newstate;
  AActor *mo;
  char *pcVar7;
  bool bVar8;
  FName local_38;
  FName local_34;
  DAngle local_30;
  PClass *pPVar6;
  PClassActor *cls;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003d6ed6;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d6ec6:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d6ed6:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe75,
                  "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  mo = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (mo == (AActor *)0x0) goto LAB_003d6dc0;
    pPVar6 = (mo->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(mo->super_DThinker).super_DObject._vptr_DObject)(mo);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (mo->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar8 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar3 && bVar8) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar8 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d6ed6;
    }
  }
  else {
    if (mo != (AActor *)0x0) goto LAB_003d6ec6;
LAB_003d6dc0:
    mo = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      uVar2 = param[1].field_0.i;
      if (numparam < 3) {
        if (defaultparam->Array[2].field_0.field_3.Type != '\0') {
          pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003d6f26;
        }
        iVar4 = defaultparam->Array[2].field_0.i;
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003d6f26:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xe77,
                        "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar4 = param[2].field_0.i;
      }
      cls = (PClassActor *)(mo->super_DThinker).super_DObject.Class;
      if (cls == (PClassActor *)0x0) {
        iVar5 = (**(mo->super_DThinker).super_DObject._vptr_DObject)(mo);
        cls = (PClassActor *)CONCAT44(extraout_var_00,iVar5);
        (mo->super_DThinker).super_DObject.Class = (PClass *)cls;
      }
      newstate = FStateLabelStorage::GetState(&StateLabels,iVar4,cls,false);
      if (uVar2 < 5) {
        piVar1 = mo->args + uVar2;
        iVar4 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar4 == 0) {
          uVar2 = (mo->flags).Value;
          if ((uVar2 >> 0x10 & 1) == 0) {
            if ((uVar2 & 4) == 0) {
              if (newstate == (FState *)0x0) {
                local_38.Index = 0x8c;
                newstate = AActor::FindState(mo,&local_38);
              }
              AActor::SetState(mo,newstate,false);
            }
            else {
              local_34.Index = 0;
              local_30.Degrees = 0.0;
              P_DamageMobj(mo,(AActor *)0x0,(AActor *)0x0,mo->health,&local_34,8,&local_30);
            }
          }
          else {
            P_ExplodeMissile(mo,(line_t_conflict *)0x0,(AActor *)0x0);
          }
        }
      }
      return 0;
    }
    pcVar7 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe76,
                "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CountdownArg)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(cnt);
	PARAM_STATE_DEF(state)

	if (cnt<0 || cnt >= 5) return 0;
	if (!self->args[cnt]--)
	{
		if (self->flags&MF_MISSILE)
		{
			P_ExplodeMissile(self, NULL, NULL);
		}
		else if (self->flags&MF_SHOOTABLE)
		{
			P_DamageMobj(self, NULL, NULL, self->health, NAME_None, DMG_FORCED);
		}
		else
		{
			if (state == nullptr) state = self->FindState(NAME_Death);
			self->SetState(state);
		}
	}
	return 0;
}